

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestlstm_var1.h
# Opt level: O1

vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> * __thiscall
cnn::ForestLSTMBuilder_var1::get_s
          (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
           *__return_storage_ptr__,ForestLSTMBuilder_var1 *this,RNNPointer *i)

{
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *__x;
  undefined8 *puVar1;
  Expression my_h;
  undefined8 *local_48;
  undefined8 *local_40;
  value_type local_30;
  
  __x = (this->c).
        super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + i->t;
  if ((long)i->t == -1) {
    __x = &this->c0;
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (__return_storage_ptr__,__x);
  (*(this->super_RNNBuilder)._vptr_RNNBuilder[4])(&local_48,this);
  if (local_48 != local_40) {
    puVar1 = local_48;
    do {
      local_30.pg = (ComputationGraph *)*puVar1;
      local_30.i.t = *(uint *)(puVar1 + 1);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                (__return_storage_ptr__,&local_30);
      puVar1 = puVar1 + 2;
    } while (puVar1 != local_40);
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Expression> get_s(RNNPointer i) const override {
    std::vector<Expression> ret = (i == -1 ? c0 : c[i]);
    for(auto my_h : get_h(i)) ret.push_back(my_h);
    return ret;
  }